

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool flatbuffers::EscapeString
               (char *s,size_t length,string *_text,bool allow_non_utf8,bool natural_utf8)

{
  uint xdigits;
  string local_f0;
  string local_d0;
  uint local_ac;
  uint local_a8;
  uint32_t low_surrogate;
  uint32_t high_surrogate;
  uint32_t base;
  string local_70;
  uint local_4c;
  char *pcStack_48;
  int ucc;
  char *utf8;
  char c;
  string *psStack_38;
  uoffset_t i;
  string *text;
  bool natural_utf8_local;
  string *psStack_28;
  bool allow_non_utf8_local;
  string *_text_local;
  size_t length_local;
  char *s_local;
  
  psStack_38 = _text;
  text._6_1_ = natural_utf8;
  text._7_1_ = allow_non_utf8;
  psStack_28 = _text;
  _text_local = (string *)length;
  length_local = (size_t)s;
  std::__cxx11::string::operator+=((string *)_text,"\"");
  utf8._4_4_ = 0;
  do {
    if (_text_local <= (string *)(ulong)utf8._4_4_) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\"");
      return true;
    }
    utf8._3_1_ = *(byte *)(length_local + utf8._4_4_);
    if (utf8._3_1_ == 8) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\b");
    }
    else if (utf8._3_1_ == 9) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\t");
    }
    else if (utf8._3_1_ == 10) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\n");
    }
    else if (utf8._3_1_ == 0xc) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\f");
    }
    else if (utf8._3_1_ == 0xd) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\r");
    }
    else if (utf8._3_1_ == 0x22) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\\"");
    }
    else if (utf8._3_1_ == 0x5c) {
      std::__cxx11::string::operator+=((string *)psStack_38,"\\\\");
    }
    else if (((char)utf8._3_1_ < ' ') || ('~' < (char)utf8._3_1_)) {
      pcStack_48 = (char *)(length_local + utf8._4_4_);
      xdigits = utf8._4_4_;
      local_4c = FromUTF8(&stack0xffffffffffffffb8);
      if ((int)local_4c < 0) {
        if ((text._7_1_ & 1) == 0) {
          return false;
        }
        std::__cxx11::string::operator+=((string *)psStack_38,"\\x");
        IntToStringHex_abi_cxx11_(&local_70,(flatbuffers *)(ulong)utf8._3_1_,2,xdigits);
        std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        if ((text._6_1_ & 1) == 0) {
          if ((int)local_4c < 0x10000) {
            std::__cxx11::string::operator+=((string *)psStack_38,"\\u");
            IntToStringHex_abi_cxx11_
                      ((string *)&high_surrogate,(flatbuffers *)(ulong)local_4c,4,xdigits);
            std::__cxx11::string::operator+=((string *)psStack_38,(string *)&high_surrogate);
            std::__cxx11::string::~string((string *)&high_surrogate);
          }
          else if ((int)local_4c < 0x110000) {
            low_surrogate = local_4c - 0x10000;
            local_a8 = (low_surrogate >> 10) + 0xd800;
            local_ac = low_surrogate & 0x3ff | 0xdc00;
            std::__cxx11::string::operator+=((string *)psStack_38,"\\u");
            IntToStringHex_abi_cxx11_(&local_d0,(flatbuffers *)(ulong)local_a8,4,xdigits);
            std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::operator+=((string *)psStack_38,"\\u");
            IntToStringHex_abi_cxx11_(&local_f0,(flatbuffers *)(ulong)local_ac,4,xdigits);
            std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
          }
        }
        else {
          std::__cxx11::string::append((char *)psStack_38,length_local + utf8._4_4_);
        }
        utf8._4_4_ = ((int)pcStack_48 - (int)length_local) - 1;
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)psStack_38,utf8._3_1_);
    }
    utf8._4_4_ = utf8._4_4_ + 1;
  } while( true );
}

Assistant:

inline bool EscapeString(const char *s, size_t length, std::string *_text,
                         bool allow_non_utf8, bool natural_utf8) {
  std::string &text = *_text;
  text += "\"";
  for (uoffset_t i = 0; i < length; i++) {
    char c = s[i];
    switch (c) {
      case '\n': text += "\\n"; break;
      case '\t': text += "\\t"; break;
      case '\r': text += "\\r"; break;
      case '\b': text += "\\b"; break;
      case '\f': text += "\\f"; break;
      case '\"': text += "\\\""; break;
      case '\\': text += "\\\\"; break;
      default:
        if (c >= ' ' && c <= '~') {
          text += c;
        } else {
          // Not printable ASCII data. Let's see if it's valid UTF-8 first:
          const char *utf8 = s + i;
          int ucc = FromUTF8(&utf8);
          if (ucc < 0) {
            if (allow_non_utf8) {
              text += "\\x";
              text += IntToStringHex(static_cast<uint8_t>(c), 2);
            } else {
              // There are two cases here:
              //
              // 1) We reached here by parsing an IDL file. In that case,
              // we previously checked for non-UTF-8, so we shouldn't reach
              // here.
              //
              // 2) We reached here by someone calling GenText()
              // on a previously-serialized flatbuffer. The data might have
              // non-UTF-8 Strings, or might be corrupt.
              //
              // In both cases, we have to give up and inform the caller
              // they have no JSON.
              return false;
            }
          } else {
            if (natural_utf8) {
              // utf8 points to past all utf-8 bytes parsed
              text.append(s + i, static_cast<size_t>(utf8 - s - i));
            } else if (ucc <= 0xFFFF) {
              // Parses as Unicode within JSON's \uXXXX range, so use that.
              text += "\\u";
              text += IntToStringHex(ucc, 4);
            } else if (ucc <= 0x10FFFF) {
              // Encode Unicode SMP values to a surrogate pair using two \u
              // escapes.
              uint32_t base = ucc - 0x10000;
              auto high_surrogate = (base >> 10) + 0xD800;
              auto low_surrogate = (base & 0x03FF) + 0xDC00;
              text += "\\u";
              text += IntToStringHex(high_surrogate, 4);
              text += "\\u";
              text += IntToStringHex(low_surrogate, 4);
            }
            // Skip past characters recognized.
            i = static_cast<uoffset_t>(utf8 - s - 1);
          }
        }
        break;
    }
  }
  text += "\"";
  return true;
}